

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O1

bool __thiscall
dlib::thread_pool_implementation::is_worker_thread
          (thread_pool_implementation *this,thread_id_type id)

{
  ulong uVar1;
  thread_id_type *ptVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = (this->worker_thread_ids).array_size;
  bVar5 = uVar1 != 0;
  if ((bVar5) && (ptVar2 = (this->worker_thread_ids).array_elements, *ptVar2 != id)) {
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (uVar1 == uVar4) break;
      uVar3 = uVar4 + 1;
    } while (ptVar2[uVar4] != id);
    bVar5 = uVar4 < uVar1;
  }
  return (bool)((this->tasks).array_size == 0 | bVar5);
}

Assistant:

bool thread_pool_implementation::
    is_worker_thread (
        const thread_id_type id
    ) const
    {
        for (unsigned long i = 0; i < worker_thread_ids.size(); ++i)
        {
            if (worker_thread_ids[i] == id)
                return true;
        }

        // if there aren't any threads in the pool then we consider all threads
        // to be worker threads
        if (tasks.size() == 0)
            return true;
        else
            return false;
    }